

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

BOOL __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::IsIdContinueNext
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr startingLocation,
          EncodedCharPtr endOfSource)

{
  bool bVar1;
  OLECHAR OVar2;
  EncodedCharPtr local_38;
  EncodedCharPtr startingLocation_local;
  uint local_28;
  codepoint_t nextCodepoint;
  codepoint_t ch;
  bool ignore;
  
  if (endOfSource <= startingLocation) {
    return 0;
  }
  local_38 = startingLocation;
  OVar2 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                    (&this->super_UTF8EncodingPolicyBase<false>,&local_38,endOfSource);
  local_28 = (uint)(ushort)OVar2;
  if (local_28 < 0x80) {
    if (((ushort)OVar2 == 0x5c) &&
       (bVar1 = TryReadEscape(this,&local_38,endOfSource,&local_28), bVar1)) {
      nextCodepoint._3_1_ = 1;
    }
  }
  else {
    nextCodepoint._3_1_ = 1;
    if ((this->es6UnicodeMode == true) &&
       (bVar1 = Js::NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar2), bVar1)) {
      bVar1 = TryReadCodePointRest<false>
                        (this,local_28,&local_38,endOfSource,
                         (codepoint_t *)((long)&startingLocation_local + 4),
                         (bool *)((long)&nextCodepoint + 3));
      if (!bVar1) {
        return 0;
      }
      goto LAB_00f168b4;
    }
  }
  startingLocation_local._4_4_ = local_28;
LAB_00f168b4:
  bVar1 = Js::CharClassifier::IsIdContinue(this->charClassifier,startingLocation_local._4_4_);
  return (uint)bVar1;
}

Assistant:

inline BOOL IsIdContinueNext(EncodedCharPtr startingLocation, EncodedCharPtr endOfSource)
    {
        codepoint_t nextCodepoint;
        bool ignore;

        if (TryReadCodePoint<false>(startingLocation, endOfSource, &nextCodepoint, &ignore, &ignore))
        {
            return charClassifier->IsIdContinue(nextCodepoint);
        }

        return false;
    }